

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-ssl.c
# Opt level: O1

int lws_ssl_capable_read(lws *wsi,uchar *buf,int len)

{
  char cVar1;
  lws_context *plVar2;
  SSL *s;
  uint n;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  char *format;
  
  if ((wsi->tls).ssl == (lws_tls_conn *)0x0) {
    iVar3 = lws_ssl_capable_read_no_ssl(wsi,buf,len);
    return iVar3;
  }
  plVar2 = wsi->context;
  cVar1 = wsi->tsi;
  puVar5 = (uint *)__errno_location();
  *puVar5 = 0;
  ERR_clear_error();
  n = SSL_read((SSL *)(wsi->tls).ssl,buf,len);
  _lws_log(0x10,"%p: SSL_read says %d\n",wsi,(ulong)n);
  if ((int)n < 1) {
    uVar4 = lws_ssl_get_error(wsi,n);
    _lws_log(0x10,"%p: ssl err %d errno %d\n",wsi,(ulong)uVar4,(ulong)*puVar5);
    if (uVar4 == 6) {
      return -1;
    }
    if (((uVar4 & 0xfffffffb) == 1) || (*puVar5 == 0x6b)) {
      wsi->field_0x2dd = wsi->field_0x2dd | 0x10;
      return -1;
    }
    iVar3 = SSL_want((SSL *)(wsi->tls).ssl);
    if (iVar3 == 3) {
      format = "%s: WANT_READ\n";
    }
    else {
      iVar3 = SSL_want((SSL *)(wsi->tls).ssl);
      if (iVar3 != 2) goto LAB_001287fc;
      format = "%s: WANT_WRITE\n";
    }
    _lws_log(0x10,format,"lws_ssl_capable_read");
    _lws_log(0x10,"%p: LWS_SSL_CAPABLE_MORE_SERVICE\n",wsi);
    n = 0xfffffffc;
  }
  else {
LAB_001287fc:
    if ((n == len) && (s = (SSL *)(wsi->tls).ssl, s != (SSL *)0x0)) {
      iVar3 = SSL_pending(s);
      if ((iVar3 != 0) && ((wsi->tls).dll_pending_tls.owner == (lws_dll2_owner *)0x0)) {
        lws_dll2_add_head(&(wsi->tls).dll_pending_tls,&plVar2->pt[cVar1].tls.dll_pending_tls_owner);
      }
    }
    else {
      lws_ssl_remove_wsi_from_buffered_list(wsi);
    }
  }
  return n;
}

Assistant:

int
lws_ssl_capable_read(struct lws *wsi, unsigned char *buf, int len)
{
	struct lws_context *context = wsi->context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	int n = 0, m;

	if (!wsi->tls.ssl)
		return lws_ssl_capable_read_no_ssl(wsi, buf, len);

	lws_stats_bump(pt, LWSSTATS_C_API_READ, 1);

	errno = 0;
	ERR_clear_error();
	n = SSL_read(wsi->tls.ssl, buf, len);
#if defined(LWS_PLAT_FREERTOS)
	if (!n && errno == LWS_ENOTCONN) {
		lwsl_debug("%p: SSL_read ENOTCONN\n", wsi);
		return LWS_SSL_CAPABLE_ERROR;
	}
#endif
#if defined(LWS_WITH_STATS)
	if (!wsi->seen_rx && wsi->accept_start_us) {
                lws_stats_bump(pt, LWSSTATS_US_SSL_RX_DELAY_AVG,
                		      lws_now_usecs() -
                			      wsi->accept_start_us);
                lws_stats_bump(pt, LWSSTATS_C_SSL_CONNS_HAD_RX, 1);
		wsi->seen_rx = 1;
	}
#endif


	lwsl_debug("%p: SSL_read says %d\n", wsi, n);
	/* manpage: returning 0 means connection shut down
	 *
	 * 2018-09-10: https://github.com/openssl/openssl/issues/1903
	 *
	 * So, in summary, if you get a 0 or -1 return from SSL_read() /
	 * SSL_write(), you should call SSL_get_error():
	 *
	 *  - If you get back SSL_ERROR_RETURN_ZERO then you know the connection
	 *    has been cleanly shutdown by the peer. To fully close the
	 *    connection you may choose to call SSL_shutdown() to send a
	 *    close_notify back.
	 *
	 *  - If you get back SSL_ERROR_SSL then some kind of internal or
	 *    protocol error has occurred. More details will be on the SSL error
	 *    queue. You can also call SSL_get_shutdown(). If this indicates a
	 *    state of SSL_RECEIVED_SHUTDOWN then you know a fatal alert has
	 *    been received from the peer (if it had been a close_notify then
	 *    SSL_get_error() would have returned SSL_ERROR_RETURN_ZERO).
	 *    SSL_ERROR_SSL is considered fatal - you should not call
	 *    SSL_shutdown() in this case.
	 *
	 *  - If you get back SSL_ERROR_SYSCALL then some kind of fatal (i.e.
	 *    non-retryable) error has occurred in a system call.
	 */
	if (n <= 0) {
		m = lws_ssl_get_error(wsi, n);
		lwsl_debug("%p: ssl err %d errno %d\n", wsi, m, errno);
		if (m == SSL_ERROR_ZERO_RETURN) /* cleanly shut down */
			return LWS_SSL_CAPABLE_ERROR;

		/* hm not retryable.. could be 0 size pkt or error  */

		if (m == SSL_ERROR_SSL || m == SSL_ERROR_SYSCALL ||
		    errno == LWS_ENOTCONN) {

			/* unclean, eg closed conn */

			wsi->socket_is_permanently_unusable = 1;

			return LWS_SSL_CAPABLE_ERROR;
		}

		/* retryable? */

		if (SSL_want_read(wsi->tls.ssl)) {
			lwsl_debug("%s: WANT_READ\n", __func__);
			lwsl_debug("%p: LWS_SSL_CAPABLE_MORE_SERVICE\n", wsi);
			return LWS_SSL_CAPABLE_MORE_SERVICE;
		}
		if (SSL_want_write(wsi->tls.ssl)) {
			lwsl_debug("%s: WANT_WRITE\n", __func__);
			lwsl_debug("%p: LWS_SSL_CAPABLE_MORE_SERVICE\n", wsi);
			return LWS_SSL_CAPABLE_MORE_SERVICE;
		}

		/* keep on trucking it seems */
	}

	lws_stats_bump(pt, LWSSTATS_B_READ, n);

#if defined(LWS_WITH_SERVER_STATUS)
	if (wsi->vhost)
		wsi->vhost->conn_stats.rx += n;
#endif

	// lwsl_hexdump_err(buf, n);

#if defined(LWS_WITH_DETAILED_LATENCY)
	if (context->detailed_latency_cb) {
		wsi->detlat.req_size = len;
		wsi->detlat.acc_size = n;
		wsi->detlat.type = LDLT_READ;
		wsi->detlat.latencies[LAT_DUR_PROXY_RX_TO_ONWARD_TX] =
			lws_now_usecs() - pt->ust_left_poll;
		wsi->detlat.latencies[LAT_DUR_USERCB] = 0;
		lws_det_lat_cb(wsi->context, &wsi->detlat);
	}
#endif

	/*
	 * if it was our buffer that limited what we read,
	 * check if SSL has additional data pending inside SSL buffers.
	 *
	 * Because these won't signal at the network layer with POLLIN
	 * and if we don't realize, this data will sit there forever
	 */
	if (n != len)
		goto bail;
	if (!wsi->tls.ssl)
		goto bail;

	if (SSL_pending(wsi->tls.ssl) &&
	    lws_dll2_is_detached(&wsi->tls.dll_pending_tls))
		lws_dll2_add_head(&wsi->tls.dll_pending_tls,
				  &pt->tls.dll_pending_tls_owner);

	return n;
bail:
	lws_ssl_remove_wsi_from_buffered_list(wsi);

	return n;
}